

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

void AnalyzeFunctionArgumentsFinal
               (ExpressionContext *ctx,SynBase *source,ExprBase *value,
               ArrayView<FunctionValue> functions,SynCallArgument *argumentHead,
               SmallArray<ArgumentData,_16U> *resultArguments)

{
  ExprBase *node_00;
  Allocator *pAVar1;
  IntrusiveList<MatchData> aliases_00;
  IntrusiveList<MatchData> aliases_01;
  IntrusiveList<ShortFunctionHandle> functions_00;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  FunctionValue *pFVar5;
  MatchData *this;
  ExprBase **ppEVar6;
  TypeBase *pTVar7;
  ExprFunctionDefinition *pEVar8;
  ExprSequence *this_00;
  ExprNullptrLiteral *this_01;
  ShortFunctionHandle *pSVar9;
  TypeFunctionSet *this_02;
  ArgumentData *__dest;
  ArrayView<TypeBase_*> setTypes;
  ArrayView<ArgumentData> currArguments;
  ArrayView<ArgumentData> currArguments_00;
  ArrayView<ExprBase_*> arr;
  bool local_402;
  ArgumentData local_328;
  ShortFunctionHandle *local_2f8;
  ShortFunctionHandle *pSStack_2f0;
  ArrayView<TypeBase*> local_2e0 [16];
  TypeFunctionSet *local_2d0;
  TypeFunctionSet *type;
  ExprBase *context_1;
  ExprGenericFunctionPrototype *node_2;
  undefined4 local_2b0;
  ExprBase *local_2a8;
  ExprVariableDefinition *local_2a0;
  ExprFunctionDefinition *local_298;
  undefined1 local_290 [8];
  SmallArray<ExprBase_*,_3U> expressions;
  ExprBase *context;
  ExprFunctionDefinition *node_1;
  ExprBase *option_2;
  undefined1 auStack_240 [4];
  uint i_1;
  IntrusiveList<ShortFunctionHandle> overloads;
  SmallArray<TypeBase_*,_16U> types;
  ExprBase *argument;
  uint k;
  bool found;
  undefined1 local_170 [12];
  ExprBase *local_160;
  ExprBase *option_1;
  MatchData *el_1;
  TypeClass *classType;
  TypeRef *contextType;
  FunctionData *function;
  IntrusiveList<MatchData> aliases;
  undefined1 auStack_120 [4];
  uint i;
  MatchData *pMStack_118;
  undefined1 local_110 [12];
  ExprBase *local_100;
  ExprBase *option;
  undefined1 local_e8 [8];
  SmallArray<ExprBase_*,_16U> options;
  SynShortFunctionDefinition *node;
  SynCallArgument *el;
  uint pos;
  SynCallArgument *argumentHead_local;
  ExprBase *value_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  ArrayView<FunctionValue> functions_local;
  
  ctx_local = (ExpressionContext *)functions.data;
  functions_local.data._0_4_ = functions.count;
  el._4_4_ = 0;
  node = (SynShortFunctionDefinition *)argumentHead;
  do {
    if (node == (SynShortFunctionDefinition *)0x0) {
      return;
    }
    bVar2 = ArrayView<FunctionValue>::empty((ArrayView<FunctionValue> *)&ctx_local);
    if ((bVar2) && ((node->arguments).head != (SynShortFunctionArgument *)0x0)) {
      anon_unknown.dwarf_8df1c::Stop
                (ctx,source,"ERROR: function argument names are unknown at this point");
    }
    options.allocator =
         (Allocator *)getType<SynShortFunctionDefinition>(&((node->arguments).tail)->super_SynBase);
    if ((SynShortFunctionDefinition *)options.allocator != (SynShortFunctionDefinition *)0x0) {
      SmallArray<ExprBase_*,_16U>::SmallArray
                ((SmallArray<ExprBase_*,_16U> *)local_e8,ctx->allocator);
      bVar2 = ArrayView<FunctionValue>::empty((ArrayView<FunctionValue> *)&ctx_local);
      pAVar1 = options.allocator;
      if (bVar2) {
        pTVar7 = value->type;
        ArrayView<ArgumentData>::ArrayView<16u>
                  ((ArrayView<ArgumentData> *)local_110,resultArguments,el._4_4_);
        IntrusiveList<MatchData>::IntrusiveList((IntrusiveList<MatchData> *)auStack_120);
        aliases_00.tail = pMStack_118;
        aliases_00.head = _auStack_120;
        currArguments._12_4_ = 0;
        currArguments.data = (ArgumentData *)local_110._0_8_;
        currArguments.count = local_110._8_4_;
        local_100 = AnalyzeShortFunctionDefinition
                              (ctx,(SynShortFunctionDefinition *)pAVar1,pTVar7,currArguments,
                               aliases_00);
        if (local_100 != (ExprBase *)0x0) {
          SmallArray<ExprBase_*,_16U>::push_back((SmallArray<ExprBase_*,_16U> *)local_e8,&local_100)
          ;
        }
      }
      else {
        for (aliases.tail._4_4_ = 0; uVar4 = aliases.tail._4_4_,
            uVar3 = ArrayView<FunctionValue>::size((ArrayView<FunctionValue> *)&ctx_local),
            uVar4 < uVar3; aliases.tail._4_4_ = aliases.tail._4_4_ + 1) {
          IntrusiveList<MatchData>::IntrusiveList((IntrusiveList<MatchData> *)&function);
          pFVar5 = ArrayView<FunctionValue>::operator[]
                             ((ArrayView<FunctionValue> *)&ctx_local,aliases.tail._4_4_);
          contextType = (TypeRef *)pFVar5->function;
          if (((FunctionData *)contextType)->scope->ownerType != (TypeBase *)0x0) {
            pFVar5 = ArrayView<FunctionValue>::operator[]
                               ((ArrayView<FunctionValue> *)&ctx_local,aliases.tail._4_4_);
            classType = (TypeClass *)getType<TypeRef>(pFVar5->context->type);
            if ((classType != (TypeClass *)0x0) &&
               (el_1 = (MatchData *)
                       getType<TypeClass>((TypeBase *)(classType->super_TypeStruct).typeScope),
               (TypeClass *)el_1 != (TypeClass *)0x0)) {
              for (option_1 = (ExprBase *)(((TypeClass *)el_1)->generics).head;
                  option_1 != (ExprBase *)0x0; option_1 = (ExprBase *)option_1->source) {
                this = ExpressionContext::get<MatchData>(ctx);
                MatchData::MatchData
                          (this,(SynIdentifier *)option_1->_vptr_ExprBase,
                           *(TypeBase **)&option_1->typeID);
                IntrusiveList<MatchData>::push_back((IntrusiveList<MatchData> *)&function,this);
              }
            }
          }
          pAVar1 = options.allocator;
          pTVar7 = *(TypeBase **)&(contextType->super_TypeBase).typeIndex;
          ArrayView<ArgumentData>::ArrayView<16u>
                    ((ArrayView<ArgumentData> *)local_170,resultArguments,el._4_4_);
          aliases_01.tail = aliases.head;
          aliases_01.head = (MatchData *)function;
          currArguments_00._12_4_ = 0;
          currArguments_00.data = (ArgumentData *)local_170._0_8_;
          currArguments_00.count = local_170._8_4_;
          local_160 = AnalyzeShortFunctionDefinition
                                (ctx,(SynShortFunctionDefinition *)pAVar1,pTVar7,currArguments_00,
                                 aliases_01);
          if (local_160 != (ExprBase *)0x0) {
            bVar2 = false;
            for (argument._0_4_ = 0;
                uVar4 = SmallArray<ExprBase_*,_16U>::size((SmallArray<ExprBase_*,_16U> *)local_e8),
                (uint)argument < uVar4; argument._0_4_ = (uint)argument + 1) {
              ppEVar6 = SmallArray<ExprBase_*,_16U>::operator[]
                                  ((SmallArray<ExprBase_*,_16U> *)local_e8,(uint)argument);
              if ((*ppEVar6)->type == local_160->type) {
                bVar2 = true;
              }
            }
            if (!bVar2) {
              SmallArray<ExprBase_*,_16U>::push_back
                        ((SmallArray<ExprBase_*,_16U> *)local_e8,&local_160);
            }
          }
        }
      }
      bVar2 = SmallArray<ExprBase_*,_16U>::empty((SmallArray<ExprBase_*,_16U> *)local_e8);
      if (bVar2) {
        uVar4 = IntrusiveList<SynShortFunctionArgument>::size
                          ((IntrusiveList<SynShortFunctionArgument> *)(options.allocator + 8));
        anon_unknown.dwarf_8df1c::Report
                  (ctx,source,
                   "ERROR: cannot find function which accepts a function with %d argument(s) as an argument #%d"
                   ,(ulong)uVar4,(ulong)(el._4_4_ + 1));
        types.allocator = (Allocator *)ExpressionContext::get<ExprError>(ctx);
        pTVar7 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
        ExprError::ExprError((ExprError *)types.allocator,source,pTVar7);
      }
      else {
        uVar4 = SmallArray<ExprBase_*,_16U>::size((SmallArray<ExprBase_*,_16U> *)local_e8);
        if (uVar4 == 1) {
          ppEVar6 = SmallArray<ExprBase_*,_16U>::operator[]
                              ((SmallArray<ExprBase_*,_16U> *)local_e8,0);
          types.allocator = (Allocator *)*ppEVar6;
        }
        else {
          SmallArray<TypeBase_*,_16U>::SmallArray
                    ((SmallArray<TypeBase_*,_16U> *)&overloads.tail,ctx->allocator);
          IntrusiveList<ShortFunctionHandle>::IntrusiveList
                    ((IntrusiveList<ShortFunctionHandle> *)auStack_240);
          for (option_2._4_4_ = 0;
              uVar4 = SmallArray<ExprBase_*,_16U>::size((SmallArray<ExprBase_*,_16U> *)local_e8),
              option_2._4_4_ < uVar4; option_2._4_4_ = option_2._4_4_ + 1) {
            ppEVar6 = SmallArray<ExprBase_*,_16U>::operator[]
                                ((SmallArray<ExprBase_*,_16U> *)local_e8,option_2._4_4_);
            node_00 = *ppEVar6;
            bVar2 = isType<ExprFunctionDefinition>(node_00);
            local_402 = true;
            if (!bVar2) {
              local_402 = isType<ExprGenericFunctionPrototype>(node_00);
            }
            if (local_402 == false) {
              __assert_fail("isType<ExprFunctionDefinition>(option) || isType<ExprGenericFunctionPrototype>(option)"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                            ,0x1cbb,
                            "void AnalyzeFunctionArgumentsFinal(ExpressionContext &, SynBase *, ExprBase *, ArrayView<FunctionValue>, SynCallArgument *, SmallArray<ArgumentData, 16> &)"
                           );
            }
            SmallArray<TypeBase_*,_16U>::push_back
                      ((SmallArray<TypeBase_*,_16U> *)&overloads.tail,&node_00->type);
            ppEVar6 = SmallArray<ExprBase_*,_16U>::operator[]
                                ((SmallArray<ExprBase_*,_16U> *)local_e8,option_2._4_4_);
            pEVar8 = getType<ExprFunctionDefinition>(*ppEVar6);
            if (pEVar8 == (ExprFunctionDefinition *)0x0) {
              context_1 = &getType<ExprGenericFunctionPrototype>(node_00)->super_ExprBase;
              if ((ExprGenericFunctionPrototype *)context_1 != (ExprGenericFunctionPrototype *)0x0)
              {
                this_02 = (TypeFunctionSet *)ExpressionContext::get<ExprNullptrLiteral>(ctx);
                ExprNullptrLiteral::ExprNullptrLiteral
                          ((ExprNullptrLiteral *)this_02,source,
                           (TypeBase *)context_1[1]._vptr_ExprBase[6]);
                type = this_02;
                pSVar9 = ExpressionContext::get<ShortFunctionHandle>(ctx);
                ShortFunctionHandle::ShortFunctionHandle
                          (pSVar9,(FunctionData *)context_1[1]._vptr_ExprBase,(ExprBase *)type);
                IntrusiveList<ShortFunctionHandle>::push_back
                          ((IntrusiveList<ShortFunctionHandle> *)auStack_240,pSVar9);
              }
            }
            else {
              expressions.allocator = (Allocator *)0x0;
              if (pEVar8->contextVariableDefinition == (ExprVariableDefinition *)0x0) {
                this_01 = ExpressionContext::get<ExprNullptrLiteral>(ctx);
                ExprNullptrLiteral::ExprNullptrLiteral(this_01,source,pEVar8->function->contextType)
                ;
                expressions.allocator = (Allocator *)this_01;
              }
              else {
                SmallArray<ExprBase_*,_3U>::SmallArray
                          ((SmallArray<ExprBase_*,_3U> *)local_290,ctx->allocator);
                local_298 = pEVar8;
                SmallArray<ExprBase_*,_3U>::push_back
                          ((SmallArray<ExprBase_*,_3U> *)local_290,(ExprBase **)&local_298);
                if (pEVar8->contextVariableDefinition != (ExprVariableDefinition *)0x0) {
                  local_2a0 = pEVar8->contextVariableDefinition;
                  SmallArray<ExprBase_*,_3U>::push_back
                            ((SmallArray<ExprBase_*,_3U> *)local_290,(ExprBase **)&local_2a0);
                }
                if (pEVar8->contextVariable != (VariableData *)0x0) {
                  local_2a8 = CreateVariableAccess(ctx,source,pEVar8->contextVariable,true);
                  SmallArray<ExprBase_*,_3U>::push_back
                            ((SmallArray<ExprBase_*,_3U> *)local_290,&local_2a8);
                }
                this_00 = ExpressionContext::get<ExprSequence>(ctx);
                pAVar1 = ctx->allocator;
                pTVar7 = pEVar8->function->contextType;
                ArrayView<ExprBase*>::ArrayView<3u>
                          ((ArrayView<ExprBase*> *)&node_2,(SmallArray<ExprBase_*,_3U> *)local_290);
                arr._12_4_ = 0;
                arr.data = (ExprBase **)node_2;
                arr.count = local_2b0;
                ExprSequence::ExprSequence(this_00,pAVar1,source,pTVar7,arr);
                expressions.allocator = (Allocator *)this_00;
                SmallArray<ExprBase_*,_3U>::~SmallArray((SmallArray<ExprBase_*,_3U> *)local_290);
              }
              pSVar9 = ExpressionContext::get<ShortFunctionHandle>(ctx);
              ShortFunctionHandle::ShortFunctionHandle
                        (pSVar9,pEVar8->function,(ExprBase *)expressions.allocator);
              IntrusiveList<ShortFunctionHandle>::push_back
                        ((IntrusiveList<ShortFunctionHandle> *)auStack_240,pSVar9);
            }
          }
          ArrayView<TypeBase*>::ArrayView<16u>
                    (local_2e0,(SmallArray<TypeBase_*,_16U> *)&overloads.tail);
          setTypes._12_4_ = 0;
          setTypes._0_12_ = local_2e0._0_12_;
          local_2d0 = ExpressionContext::GetFunctionSetType(ctx,setTypes);
          types.allocator = (Allocator *)ExpressionContext::get<ExprShortFunctionOverloadSet>(ctx);
          local_2f8 = _auStack_240;
          pSStack_2f0 = overloads.head;
          functions_00.tail = overloads.head;
          functions_00.head = _auStack_240;
          ExprShortFunctionOverloadSet::ExprShortFunctionOverloadSet
                    ((ExprShortFunctionOverloadSet *)types.allocator,source,
                     &local_2d0->super_TypeBase,functions_00);
          SmallArray<TypeBase_*,_16U>::~SmallArray((SmallArray<TypeBase_*,_16U> *)&overloads.tail);
        }
      }
      ArgumentData::ArgumentData
                (&local_328,&node->super_SynBase,false,(SynIdentifier *)(node->arguments).head,
                 (TypeBase *)types.allocator[3]._vptr_Allocator,(ExprBase *)types.allocator);
      __dest = SmallArray<ArgumentData,_16U>::operator[](resultArguments,el._4_4_);
      memcpy(__dest,&local_328,0x30);
      SmallArray<ExprBase_*,_16U>::~SmallArray((SmallArray<ExprBase_*,_16U> *)local_e8);
    }
    el._4_4_ = el._4_4_ + 1;
    node = (SynShortFunctionDefinition *)getType<SynCallArgument>((node->super_SynBase).next);
  } while( true );
}

Assistant:

void AnalyzeFunctionArgumentsFinal(ExpressionContext &ctx, SynBase *source, ExprBase *value, ArrayView<FunctionValue> functions, SynCallArgument *argumentHead, SmallArray<ArgumentData, 16> &resultArguments)
{
	unsigned pos = 0;

	for(SynCallArgument *el = argumentHead; el; el = getType<SynCallArgument>(el->next))
	{
		if(functions.empty() && el->name)
			Stop(ctx, source, "ERROR: function argument names are unknown at this point");

		if(SynShortFunctionDefinition *node = getType<SynShortFunctionDefinition>(el->value))
		{
			SmallArray<ExprBase*, 16> options(ctx.allocator);

			if(functions.empty())
			{
				if(ExprBase *option = AnalyzeShortFunctionDefinition(ctx, node, value->type, ArrayView<ArgumentData>(resultArguments, pos), IntrusiveList<MatchData>()))
					options.push_back(option);
			}
			else
			{
				for(unsigned i = 0; i < functions.size(); i++)
				{
					IntrusiveList<MatchData> aliases;

					FunctionData *function = functions[i].function;

					if(function->scope->ownerType)
					{
						if(TypeRef *contextType = getType<TypeRef>(functions[i].context->type))
						{
							if(TypeClass *classType = getType<TypeClass>(contextType->subType))
							{
								for(MatchData *el = classType->generics.head; el; el = el->next)
									aliases.push_back(new (ctx.get<MatchData>()) MatchData(el->name, el->type));
							}
						}
					}

					if(ExprBase *option = AnalyzeShortFunctionDefinition(ctx, node, function->type, ArrayView<ArgumentData>(resultArguments, pos), aliases))
					{
						bool found = false;

						for(unsigned k = 0; k < options.size(); k++)
						{
							if(options[k]->type == option->type)
								found = true;
						}

						if(!found)
							options.push_back(option);
					}
				}
			}

			ExprBase *argument = NULL;

			if(options.empty())
			{
				Report(ctx, source, "ERROR: cannot find function which accepts a function with %d argument(s) as an argument #%d", node->arguments.size(), pos + 1);

				argument = new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());
			}
			else if(options.size() == 1)
			{
				argument = options[0];
			}
			else
			{
				SmallArray<TypeBase*, 16> types(ctx.allocator);

				IntrusiveList<ShortFunctionHandle> overloads;

				for(unsigned i = 0; i < options.size(); i++)
				{
					ExprBase *option = options[i];

					assert(isType<ExprFunctionDefinition>(option) || isType<ExprGenericFunctionPrototype>(option));

					types.push_back(option->type);

					if(ExprFunctionDefinition *node = getType<ExprFunctionDefinition>(options[i]))
					{
						ExprBase *context = NULL;

						if(node->contextVariableDefinition)
						{
							SmallArray<ExprBase*, 3> expressions(ctx.allocator);

							expressions.push_back(node);

							if(node->contextVariableDefinition)
								expressions.push_back(node->contextVariableDefinition);

							if(node->contextVariable)
								expressions.push_back(CreateVariableAccess(ctx, source, node->contextVariable, true));

							context = new (ctx.get<ExprSequence>()) ExprSequence(ctx.allocator, source, node->function->contextType, expressions);
						}
						else
						{
							context = new (ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(source, node->function->contextType);
						}

						overloads.push_back(new (ctx.get<ShortFunctionHandle>()) ShortFunctionHandle(node->function, context));
					}
					else if(ExprGenericFunctionPrototype *node = getType<ExprGenericFunctionPrototype>(option))
					{
						ExprBase *context = new (ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(source, node->function->contextType);

						overloads.push_back(new (ctx.get<ShortFunctionHandle>()) ShortFunctionHandle(node->function, context));
					}
				}

				TypeFunctionSet *type = ctx.GetFunctionSetType(types);

				argument = new (ctx.get<ExprShortFunctionOverloadSet>()) ExprShortFunctionOverloadSet(source, type, overloads);
			}

			resultArguments[pos++] = ArgumentData(el, false, el->name, argument->type, argument);
		}
		else
		{
			pos++;
		}
	}
}